

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O2

void __thiscall
klogic::learning::
teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
::learn_run<TolerancePicker>
          (teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
           *this,TolerancePicker *picker)

{
  mlmvn *this_00;
  bool bVar1;
  pointer sample;
  desired_type actual;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_60;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_48;
  
  for (sample = (this->_samples).
                super__Vector_base<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sample != (this->_samples).
                super__Vector_base<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; sample = sample + 1) {
    mlmvn::output((cvector *)&local_48,this->learner,&sample->input);
    bVar1 = TolerancePicker::operator()(picker,sample,(cvector *)&local_48);
    if (bVar1) {
      this_00 = this->learner;
      learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
      operator()((cvector *)&local_60,
                 (learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                  *)&this->field_0x20,(cvector *)&local_48,&sample->desired);
      mlmvn::learn(this_00,&sample->input,(cvector *)&local_60,1.0);
      std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
                (&local_60);
    }
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              (&local_48);
  }
  return;
}

Assistant:

void learn_run(SamplePicker const &picker = SamplePicker()) {
                for (typename std::vector<Sample>::const_iterator i = _samples.begin();
                        i != _samples.end(); ++i) {

                    typename Sample::desired_type actual = learner.output(i->input);

                    if (picker(*i, actual))
                        learner.learn(i->input, learn_error(actual, i->desired));
                }
            }